

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_shl_16(c_v256 *__return_storage_ptr__,c_v256 a,uint c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  c_v256 cVar5;
  c_v256 *extraout_RAX;
  undefined1 auVar6 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  auVar6 = in_ZMM0._0_32_;
  if (c < 0x10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a.u64[3];
    auVar1 = vpmovzxwd_avx(auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a.u64[2];
    auVar2 = vpmovzxwd_avx(auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = a.u64[0];
    auVar3 = vpmovzxwd_avx(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = a.u64[1];
    auVar4 = vpmovzxwd_avx(auVar4);
    auVar6._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar6._16_16_ = ZEXT116(1) * auVar1;
    auVar6 = vpslld_avx2(auVar6,ZEXT416(c));
    auVar7._16_16_ = _DAT_00c224e0;
    auVar7._0_16_ = _DAT_00c224e0;
    auVar6 = vpshufb_avx2(auVar6,auVar7);
    auVar8._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar3;
    auVar8._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
    auVar8 = vpslld_avx2(auVar8,ZEXT416(c));
    auVar8 = vpshufb_avx2(auVar8,auVar7);
    auVar6 = vpunpcklqdq_avx2(auVar8,auVar6);
    cVar5 = (c_v256)vpermq_avx2(auVar6,0xd8);
    *__return_storage_ptr__ = cVar5;
    return __return_storage_ptr__;
  }
  c_v256_shl_16();
  vpsllw_avx2(auVar6,ZEXT416(c));
  return extraout_RAX;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shl_16(c_v256 a, unsigned int c) {
  return c_v256_from_v128(c_v128_shl_16(a.v128[1], c),
                          c_v128_shl_16(a.v128[0], c));
}